

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<VectorWriter,std::vector<uint256,std::allocator<uint256>>>
          (VectorFormatter<DefaultFormatter> *this,VectorWriter *s,
          vector<uint256,_std::allocator<uint256>_> *v)

{
  long lVar1;
  base_blob<256U> *pbVar2;
  value_type *elem;
  base_blob<256U> *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<VectorWriter>
            (s,(long)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 5);
  pbVar2 = &((v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
             super__Vector_impl_data._M_finish)->super_base_blob<256U>;
  for (this_00 = &((v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                   super__Vector_impl_data._M_start)->super_base_blob<256U>; this_00 != pbVar2;
      this_00 = this_00 + 1) {
    base_blob<256U>::Serialize<VectorWriter>(this_00,s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }